

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

void __thiscall Clasp::Cli::ClaspAppBase::printHelp(ClaspAppBase *this,OptionContext *root)

{
  DescriptionLevel DVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  ConfigKey k;
  
  Potassco::Application::printHelp(&this->super_Application,root);
  DVar1 = root->descLevel_;
  if (0 < (int)DVar1) {
    pcVar3 = ClaspCliConfig::getDefaults(Asp);
    printf("[asp] %s\n",pcVar3);
    pcVar3 = ClaspCliConfig::getDefaults(Sat);
    printf("[cnf] %s\n",pcVar3);
    k = config_asp_default;
    pcVar3 = ClaspCliConfig::getDefaults(Pb);
    printf("[opb] %s\n",pcVar3);
    DVar1 = root->descLevel_;
    if (1 < (int)DVar1) {
      pcVar3 = "\nDefault configurations:";
      puts("\nDefault configurations:");
      do {
        printConfig((ClaspAppBase *)pcVar3,k);
        k = k + config_asp_default;
      } while (k != config_default_max_value);
      goto LAB_00116092;
    }
  }
  if (DVar1 == desc_level_default) {
    iVar2 = (**(this->super_Application)._vptr_Application)(this);
    printf("\nType \'%s --help=2\' for more options and defaults\n",CONCAT44(extraout_var,iVar2));
    pcVar3 = "and ";
  }
  else {
    pcVar3 = "\nType ";
  }
  iVar2 = (**(this->super_Application)._vptr_Application)(this);
  printf("%s \'%s --help=3\' for all options and configurations.\n",pcVar3,
         CONCAT44(extraout_var_00,iVar2));
LAB_00116092:
  fflush(_stdout);
  return;
}

Assistant:

void ClaspAppBase::printHelp(const Potassco::ProgramOptions::OptionContext& root) {
	Potassco::Application::printHelp(root);
	if (root.getActiveDescLevel() >= Potassco::ProgramOptions::desc_level_e1) {
		printf("[asp] %s\n", ClaspCliConfig::getDefaults(Problem_t::Asp));
		printf("[cnf] %s\n", ClaspCliConfig::getDefaults(Problem_t::Sat));
		printf("[opb] %s\n", ClaspCliConfig::getDefaults(Problem_t::Pb));
	}
	if (root.getActiveDescLevel() >= Potassco::ProgramOptions::desc_level_e2) {
		printf("\nDefault configurations:\n");
		printDefaultConfigs();
	}
	else {
		const char* ht3 = "\nType ";
		if (root.getActiveDescLevel() == Potassco::ProgramOptions::desc_level_default) {
			printf("\nType '%s --help=2' for more options and defaults\n", getName());
			ht3 = "and ";
		}
		printf("%s '%s --help=3' for all options and configurations.\n", ht3, getName());
	}
	fflush(stdout);
}